

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O3

type __thiscall obs::signal<int_()>::operator()<>(signal<int_()> *this)

{
  bool bVar1;
  int iVar2;
  iterator __begin0;
  iterator __end0;
  iterator iStack_68;
  iterator local_40;
  
  safe_list<obs::slot<int_()>_>::begin(&iStack_68,&this->m_slots);
  safe_list<obs::slot<int_()>_>::end(&local_40,&this->m_slots);
  iVar2 = 0;
  while( true ) {
    bVar1 = safe_list<obs::slot<int_()>_>::iterator::operator!=(&iStack_68,&local_40);
    if (!bVar1) {
      safe_list<obs::slot<int_()>_>::iterator::~iterator(&local_40);
      safe_list<obs::slot<int_()>_>::iterator::~iterator(&iStack_68);
      return iVar2;
    }
    if ((iStack_68.m_node == (node *)0x0) || (iStack_68.m_locked == false)) break;
    if (iStack_68.m_value != (slot<int_()> *)0x0) {
      if (((iStack_68.m_value)->f).super__Function_base._M_manager == (_Manager_type)0x0) {
        __assert_fail("f",
                      "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h"
                      ,0x33,
                      "R obs::slot<int ()>::operator()(Args2 &&...) [Callable = int (), Args2 = <>]"
                     );
      }
      iVar2 = (*((iStack_68.m_value)->f)._M_invoker)((_Any_data *)&(iStack_68.m_value)->f);
    }
    safe_list<obs::slot<int_()>_>::iterator::operator++(&iStack_68);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,
                "T *obs::safe_list<obs::slot<int ()>>::iterator::operator*() const [T = obs::slot<int ()>]"
               );
}

Assistant:

typename std::enable_if<!std::is_void<R>::value, R>::type
  operator()(Args2&&...args) {
    R result = R();
    for (auto slot : m_slots)
      if (slot)
        result = (*slot)(std::forward<Args2>(args)...);
    return result;
  }